

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

TreeNode * si9ma::BinaryTree::get_next(TreeNode *head)

{
  bool bVar1;
  TreeNode *local_28;
  TreeNode *parent;
  TreeNode *cur;
  TreeNode *head_local;
  
  if (head == (TreeNode *)0x0) {
    head_local = (TreeNode *)0x0;
  }
  else if (head->right == (TreeNode *)0x0) {
    local_28 = head->parent;
    parent = head;
    while( true ) {
      bVar1 = false;
      if (local_28 != (TreeNode *)0x0) {
        bVar1 = local_28->left != parent;
      }
      if (!bVar1) break;
      parent = local_28;
      local_28 = local_28->parent;
    }
    head_local = local_28;
  }
  else {
    head_local = get_left_most(head->right);
  }
  return head_local;
}

Assistant:

const TreeNode* BinaryTree::get_next(const TreeNode *head) {
        if (head == nullptr)
            return head;

        if (head->right != nullptr)
            return get_left_most(head->right);
        else{
            auto *cur = head;
            auto *parent = head->parent;

            while (parent != nullptr && parent->left != cur){
                cur = parent;
                parent = parent->parent;
            }

            return parent;
        }
    }